

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O3

void Fra_SmlInitializeGiven(Fra_Sml_t *p,Vec_Str_t *vSimInfo)

{
  long lVar1;
  uint *puVar2;
  Aig_Man_t *pAVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  
  pAVar3 = p->pAig;
  uVar6 = vSimInfo->nSize / pAVar3->nObjs[2];
  if (pAVar3->nRegs != 0) {
    __assert_fail("Aig_ManRegNum(p->pAig) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraSim.c"
                  ,0x39b,"void Fra_SmlInitializeGiven(Fra_Sml_t *, Vec_Str_t *)");
  }
  if (vSimInfo->nSize % pAVar3->nObjs[2] != 0) {
    __assert_fail("Vec_StrSize(vSimInfo) % Aig_ManCiNum(p->pAig) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraSim.c"
                  ,0x39c,"void Fra_SmlInitializeGiven(Fra_Sml_t *, Vec_Str_t *)");
  }
  uVar9 = p->nWordsTotal * 0x20;
  if ((int)uVar9 < (int)uVar6) {
    __assert_fail("nPats <= nPatsPadded",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraSim.c"
                  ,0x39d,"void Fra_SmlInitializeGiven(Fra_Sml_t *, Vec_Str_t *)");
  }
  pVVar4 = pAVar3->vCis;
  if (0 < pVVar4->nSize) {
    ppvVar5 = pVVar4->pArray;
    lVar11 = 0;
    do {
      lVar1 = (long)(*(int *)((long)ppvVar5[lVar11] + 0x24) * p->nWordsTotal) * 4;
      if (0 < p->nWordsTotal) {
        lVar8 = 0;
        do {
          *(undefined4 *)((long)&p[1].pAig + lVar8 * 4 + lVar1) = 0;
          lVar8 = lVar8 + 1;
        } while (lVar8 < p->nWordsTotal);
      }
      uVar7 = 0;
      uVar10 = uVar7;
      if (0 < (int)uVar6) {
        do {
          uVar10 = pAVar3->nObjs[2] * uVar7 + (int)lVar11;
          if (((int)uVar10 < 0) || (vSimInfo->nSize <= (int)uVar10)) goto LAB_006a1e55;
          if (vSimInfo->pArray[uVar10] != '\0') {
            puVar2 = (uint *)((long)&p[1].pAig + (ulong)(uVar7 >> 5) * 4 + lVar1);
            *puVar2 = *puVar2 | 1 << ((byte)uVar7 & 0x1f);
          }
          uVar7 = uVar7 + 1;
          uVar10 = uVar6;
        } while (uVar6 != uVar7);
      }
      if ((int)uVar10 < (int)uVar9) {
        do {
          uVar7 = pAVar3->nObjs[2] * (uVar6 - 1) + (int)lVar11;
          if (((int)uVar7 < 0) || (vSimInfo->nSize <= (int)uVar7)) {
LAB_006a1e55:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                          ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
          }
          if (vSimInfo->pArray[uVar7] != '\0') {
            puVar2 = (uint *)((long)&p[1].pAig + (ulong)(uVar10 >> 5) * 4 + lVar1);
            *puVar2 = *puVar2 | 1 << ((byte)uVar10 & 0x1f);
          }
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < pVVar4->nSize);
  }
  return;
}

Assistant:

void Fra_SmlInitializeGiven( Fra_Sml_t * p, Vec_Str_t * vSimInfo )
{
    Aig_Obj_t * pObj;
    unsigned * pSims;
    int i, k, nPats = Vec_StrSize(vSimInfo) / Aig_ManCiNum(p->pAig);
    int nPatsPadded = p->nWordsTotal * 32;
    assert( Aig_ManRegNum(p->pAig) == 0 );
    assert( Vec_StrSize(vSimInfo) % Aig_ManCiNum(p->pAig) == 0 );
    assert( nPats <= nPatsPadded );
    Aig_ManForEachCi( p->pAig, pObj, i )
    {
        pSims = Fra_ObjSim( p, pObj->Id );
        // clean data
        for ( k = 0; k < p->nWordsTotal; k++ )
            pSims[k] = 0;
        // load patterns
        for ( k = 0; k < nPats; k++ )
            if ( Vec_StrEntry(vSimInfo, k * Aig_ManCiNum(p->pAig) + i) )
                Abc_InfoSetBit( pSims, k );
        // pad the remaining bits with the value of the last pattern
        for ( ; k < nPatsPadded; k++ )
            if ( Vec_StrEntry(vSimInfo, (nPats-1) * Aig_ManCiNum(p->pAig) + i) )
                Abc_InfoSetBit( pSims, k );
    }
}